

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall SQVM::ToString(SQVM *this,SQObjectPtr *o,SQObjectPtr *res)

{
  int iVar1;
  byte bVar2;
  bool bVar3;
  SQChar *pSVar4;
  SQObjectValue in_RDX;
  char *__format;
  SQObjectPtrVec *in_RSI;
  undefined8 in_RDI;
  SQObjectPtr closure;
  SQObjectPtr *in_stack_ffffffffffffff88;
  SQVM *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  SQMetaMethod in_stack_ffffffffffffff9c;
  SQSharedState *in_stack_ffffffffffffffa0;
  undefined7 in_stack_ffffffffffffffa8;
  SQObjectValue local_20;
  SQObjectPtrVec *local_18;
  byte local_1;
  
  iVar1 = *(int *)&in_RSI->_vals;
  local_18 = in_RSI;
  if (iVar1 == 0x1000008) {
    pSVar4 = SQSharedState::GetScratchPad
                       (in_stack_ffffffffffffffa0,
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    __format = "false";
    if (local_18->_size != 0) {
      __format = "true";
    }
    snprintf(pSVar4,6,__format);
  }
  else if (iVar1 == 0x5000002) {
    pSVar4 = SQSharedState::GetScratchPad
                       (in_stack_ffffffffffffffa0,
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    snprintf(pSVar4,0x32,"%lld",local_18->_size);
  }
  else if (iVar1 == 0x5000004) {
    pSVar4 = SQSharedState::GetScratchPad
                       (in_stack_ffffffffffffffa0,
                        CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    snprintf(pSVar4,0x32,"%g",(double)*(float *)&local_18->_size);
  }
  else {
    if (iVar1 == 0x8000010) {
      ::SQObjectPtr::operator=
                ((SQObjectPtr *)in_stack_ffffffffffffffa0,
                 (SQObjectPtr *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
      local_1 = 1;
      goto LAB_00142489;
    }
    if ((((iVar1 == 0xa000020) || (iVar1 == 0xa000080)) || (iVar1 == 0xa008000)) &&
       (*(long *)(in_RSI->_size + 0x30) != 0)) {
      in_stack_ffffffffffffffa0 = (SQSharedState *)&stack0xffffffffffffffd0;
      local_20 = in_RDX;
      ::SQObjectPtr::SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffffa0);
      bVar2 = (**(code **)(*(long *)local_18->_size + 0x30))
                        ((long *)local_18->_size,in_RDI,0xf,in_stack_ffffffffffffffa0);
      if ((bVar2 & 1) == 0) {
LAB_001423d3:
        bVar3 = false;
      }
      else {
        Push(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        bVar3 = CallMetaMethod((SQVM *)CONCAT17(bVar2,in_stack_ffffffffffffffa8),
                               (SQObjectPtr *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c,
                               (SQInteger)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
        in_stack_ffffffffffffff9c = CONCAT13(bVar3,(int3)in_stack_ffffffffffffff9c);
        if (bVar3) {
          if (*(int *)&((local_20.pTable)->super_SQDelegable).super_SQCollectable.super_SQRefCounted
                       ._vptr_SQRefCounted != 0x8000010) goto LAB_001423d3;
          local_1 = 1;
          bVar3 = true;
        }
        else {
          local_1 = 0;
          bVar3 = true;
        }
      }
      ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_ffffffffffffff90);
      if (bVar3) goto LAB_00142489;
    }
    in_stack_ffffffffffffff90 =
         (SQVM *)SQSharedState::GetScratchPad
                           (in_stack_ffffffffffffffa0,
                            CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
    pSVar4 = GetTypeName((SQObjectPtr *)0x14241d);
    snprintf((char *)in_stack_ffffffffffffff90,0x42,"(%s : 0x%p)",pSVar4,local_18->_size);
  }
  SQSharedState::GetScratchPad
            (in_stack_ffffffffffffffa0,CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98)
            );
  SQString::Create(in_stack_ffffffffffffffa0,
                   (SQChar *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                   (SQInteger)in_stack_ffffffffffffff90);
  ::SQObjectPtr::operator=
            ((SQObjectPtr *)in_stack_ffffffffffffffa0,
             (SQString *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
  local_1 = 1;
LAB_00142489:
  return (bool)(local_1 & 1);
}

Assistant:

bool SQVM::ToString(const SQObjectPtr &o,SQObjectPtr &res)
{
    switch(type(o)) {
    case OT_STRING:
        res = o;
        return true;
    case OT_FLOAT:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_SC("%g"),_float(o));
        break;
    case OT_INTEGER:
        scsprintf(_sp(sq_rsl(NUMBER_MAX_CHAR+1)),sq_rsl(NUMBER_MAX_CHAR),_PRINT_INT_FMT,_integer(o));
        break;
    case OT_BOOL:
        scsprintf(_sp(sq_rsl(6)),sq_rsl(6),_integer(o)?_SC("true"):_SC("false"));
        break;
    case OT_TABLE:
    case OT_USERDATA:
    case OT_INSTANCE:
        if(_delegable(o)->_delegate) {
            SQObjectPtr closure;
            if(_delegable(o)->GetMetaMethod(this, MT_TOSTRING, closure)) {
                Push(o);
                if(CallMetaMethod(closure,MT_TOSTRING,1,res)) {
                    if(type(res) == OT_STRING)
                        return true;
                }
                else {
                    return false;
                }
            }
        }
    default:
        scsprintf(_sp(sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR)),sq_rsl((sizeof(void*)*2)+NUMBER_MAX_CHAR),_SC("(%s : 0x%p)"),GetTypeName(o),(void*)_rawval(o));
    }
    res = SQString::Create(_ss(this),_spval);
    return true;
}